

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.h
# Opt level: O0

void llmsset_set_size(llmsset_t dbs,size_t size)

{
  size_t size_local;
  llmsset_t dbs_local;
  
  if ((0x80 < size) && (size <= dbs->max_size)) {
    dbs->table_size = size;
    dbs->mask = dbs->table_size - 1;
    LOCK();
    dbs->threshold = (short)LZCOUNT(dbs->table_size) * -2 + 0xc0;
    UNLOCK();
  }
  return;
}

Assistant:

static inline void
llmsset_set_size(llmsset_t dbs, size_t size)
{
    /* check bounds (don't be rediculous) */
    if (size > 128 && size <= dbs->max_size) {
        dbs->table_size = size;
#if LLMSSET_MASK
        /* Warning: if size is not a power of two, you will get interesting behavior */
        dbs->mask = dbs->table_size - 1;
#endif
        /* Set threshold: number of cache lines to probe before giving up on node insertion */
        dbs->threshold = 192 - 2 * __builtin_clzll(dbs->table_size);
    }
}